

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O0

int mbedtls_camellia_setkey_dec(mbedtls_camellia_context *ctx,uchar *key,uint keybits)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  uint32_t *puVar4;
  uint32_t *local_158;
  uint32_t *SK;
  uint32_t *RK;
  mbedtls_camellia_context cty;
  size_t i;
  int ret;
  int idx;
  uint keybits_local;
  uchar *key_local;
  mbedtls_camellia_context *ctx_local;
  
  mbedtls_camellia_init((mbedtls_camellia_context *)((long)&RK + 4));
  iVar1 = mbedtls_camellia_setkey_enc((mbedtls_camellia_context *)((long)&RK + 4),key,keybits);
  if (iVar1 == 0) {
    ctx->nr = RK._4_4_;
    uVar2 = (uint)(ctx->nr == 4);
    lVar3 = (long)(int)(uVar2 << 4);
    ctx->rk[0] = cty.rk[lVar3 + 0x2e];
    ctx->rk[1] = cty.rk[lVar3 + 0x2f];
    ctx->rk[2] = cty.rk[lVar3 + 0x30];
    SK = ctx->rk + 4;
    ctx->rk[3] = cty.rk[lVar3 + 0x31];
    local_158 = cty.rk + lVar3 + 0x2c;
    for (cty.rk._264_8_ = SEXT48((int)(uVar2 * 8 + 0x16)); cty.rk._264_8_ != 0;
        cty.rk._264_8_ = cty.rk._264_8_ + -1) {
      puVar4 = SK + 1;
      *SK = *local_158;
      SK = SK + 2;
      *puVar4 = local_158[1];
      local_158 = local_158 + -2;
    }
    *SK = local_158[-2];
    SK[1] = ((mbedtls_camellia_context *)(local_158 + -1))->nr;
    SK[2] = *local_158;
    SK[3] = local_158[1];
  }
  mbedtls_camellia_free((mbedtls_camellia_context *)((long)&RK + 4));
  return iVar1;
}

Assistant:

int mbedtls_camellia_setkey_dec( mbedtls_camellia_context *ctx, const unsigned char *key,
                         unsigned int keybits )
{
    int idx, ret;
    size_t i;
    mbedtls_camellia_context cty;
    uint32_t *RK;
    uint32_t *SK;

    mbedtls_camellia_init( &cty );

    /* Also checks keybits */
    if( ( ret = mbedtls_camellia_setkey_enc( &cty, key, keybits ) ) != 0 )
        goto exit;

    ctx->nr = cty.nr;
    idx = ( ctx->nr == 4 );

    RK = ctx->rk;
    SK = cty.rk + 24 * 2 + 8 * idx * 2;

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;

    for( i = 22 + 8 * idx, SK -= 6; i > 0; i--, SK -= 4 )
    {
        *RK++ = *SK++;
        *RK++ = *SK++;
    }

    SK -= 2;

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;

exit:
    mbedtls_camellia_free( &cty );

    return( ret );
}